

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_stroke_rect(nk_command_buffer *b,nk_rect rect,float rounding,float line_thickness,nk_color c
                   )

{
  void *pvVar1;
  float local_48;
  float local_44;
  nk_rect *clip;
  nk_command_rect *cmd;
  float line_thickness_local;
  float rounding_local;
  nk_command_buffer *b_local;
  float fStack_18;
  nk_color c_local;
  nk_rect rect_local;
  
  if (b != (nk_command_buffer *)0x0) {
    if ((b != (nk_command_buffer *)0x0) && (b_local._7_1_ = c.a, b_local._7_1_ != '\0')) {
      rect_local.x = rect.w;
      if ((rect_local.x != 0.0) || (NAN(rect_local.x))) {
        rect_local.y = rect.h;
        if (((rect_local.y != 0.0) || (NAN(rect_local.y))) && (0.0 < line_thickness)) {
          fStack_18 = rect.x;
          c_local = (nk_color)rect.y;
          if (((b->use_clipping == 0) ||
              ((((b->clip).x <= fStack_18 + rect_local.x && (fStack_18 <= (b->clip).x + (b->clip).w)
                ) && (((b->clip).y <= (float)c_local + rect_local.y &&
                      ((float)c_local <= (b->clip).y + (b->clip).h)))))) &&
             (pvVar1 = nk_command_buffer_push(b,NK_COMMAND_RECT,0x20), pvVar1 != (void *)0x0)) {
            *(short *)((long)pvVar1 + 0x10) = (short)(int)rounding;
            *(short *)((long)pvVar1 + 0x12) = (short)(int)line_thickness;
            *(short *)((long)pvVar1 + 0x14) = (short)(int)fStack_18;
            *(short *)((long)pvVar1 + 0x16) = (short)(int)(float)c_local;
            if (rect_local.x <= 0.0) {
              local_44 = 0.0;
            }
            else {
              local_44 = rect_local.x;
            }
            *(short *)((long)pvVar1 + 0x18) = (short)(int)local_44;
            if (rect_local.y <= 0.0) {
              local_48 = 0.0;
            }
            else {
              local_48 = rect_local.y;
            }
            *(short *)((long)pvVar1 + 0x1a) = (short)(int)local_48;
            *(nk_color *)((long)pvVar1 + 0x1c) = c;
          }
        }
      }
    }
    return;
  }
  __assert_fail("b",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x2246,
                "void nk_stroke_rect(struct nk_command_buffer *, struct nk_rect, float, float, struct nk_color)"
               );
}

Assistant:

NK_API void
nk_stroke_rect(struct nk_command_buffer *b, struct nk_rect rect,
    float rounding, float line_thickness, struct nk_color c)
{
    struct nk_command_rect *cmd;
    NK_ASSERT(b);
    if (!b || c.a == 0 || rect.w == 0 || rect.h == 0 || line_thickness <= 0) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INTERSECT(rect.x, rect.y, rect.w, rect.h,
            clip->x, clip->y, clip->w, clip->h)) return;
    }
    cmd = (struct nk_command_rect*)
        nk_command_buffer_push(b, NK_COMMAND_RECT, sizeof(*cmd));
    if (!cmd) return;
    cmd->rounding = (unsigned short)rounding;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->x = (short)rect.x;
    cmd->y = (short)rect.y;
    cmd->w = (unsigned short)NK_MAX(0, rect.w);
    cmd->h = (unsigned short)NK_MAX(0, rect.h);
    cmd->color = c;
}